

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tetgen.cxx
# Opt level: O0

int __thiscall
tetgenmesh::checkflipeligibility
          (tetgenmesh *this,int fliptype,point pa,point pb,point pc,point pd,point pe,int level,
          int edgepivot,flipconstraints *fc)

{
  double local_98;
  double diff;
  double cosmaxd;
  int local_80;
  int i;
  int rejflag;
  int intflag;
  int poss [4];
  int types [2];
  interresult dir;
  point tmppts [3];
  point pd_local;
  point pc_local;
  point pb_local;
  point pa_local;
  int fliptype_local;
  tetgenmesh *this_local;
  
  local_80 = 0;
  if (fc->seg[0] != (point)0x0) {
    if (fliptype == 1) {
      stack0xffffffffffffffa8 = pa;
      for (cosmaxd._4_4_ = 0; cosmaxd._4_4_ < 3 && local_80 == 0; cosmaxd._4_4_ = cosmaxd._4_4_ + 1)
      {
        if (*(point *)(types + (long)cosmaxd._4_4_ * 2 + 1) != this->dummypoint) {
          i = tri_edge_test(this,pe,pd,*(point *)(types + (long)cosmaxd._4_4_ * 2 + 1),fc->seg[0],
                            fc->seg[1],(point)0x0,1,poss + 3,&rejflag);
          if (i == 2) {
            types[0] = poss[3];
            if (poss[3] == 9) {
              local_80 = 1;
            }
            else if ((poss[3] == 8) && (rejflag == 0)) {
              local_80 = 1;
            }
          }
          else if (((i == 4) && (types[0] = poss[3], poss[3] == 8)) && (rejflag == 0)) {
            local_80 = 1;
          }
        }
      }
    }
    else if ((fliptype == 2) && (pc != this->dummypoint)) {
      i = tri_edge_test(this,pa,pb,pc,fc->seg[0],fc->seg[1],(point)0x0,1,poss + 3,&rejflag);
      if (i == 2) {
        types[0] = poss[3];
        if (poss[3] == 9) {
          local_80 = 1;
        }
      }
      else if ((i == 4) && (types[0] = poss[3], poss[3] == 8)) {
        local_80 = 1;
      }
    }
  }
  if (((fc->fac[0] != (point)0x0) && (local_80 == 0)) && (fliptype == 1)) {
    i = tri_edge_test(this,fc->fac[0],fc->fac[1],fc->fac[2],pe,pd,(point)0x0,1,poss + 3,&rejflag);
    if (i == 2) {
      types[0] = poss[3];
      if (poss[3] == 9) {
        local_80 = 1;
      }
      else if (poss[3] == 8) {
        local_80 = 1;
      }
    }
    else if (i == 4) {
      for (cosmaxd._4_4_ = 0; cosmaxd._4_4_ < 2 && local_80 == 0; cosmaxd._4_4_ = cosmaxd._4_4_ + 1)
      {
        types[0] = poss[(long)cosmaxd._4_4_ + 3];
        if (types[0] == 9) {
          local_80 = 1;
        }
        else if (types[0] == 8) {
          local_80 = 1;
        }
      }
    }
  }
  if ((((fc->remvert != (point)0x0) && (local_80 == 0)) && (fliptype == 1)) &&
     ((pd == fc->remvert || (pe == fc->remvert)))) {
    local_80 = 1;
  }
  if ((fc->remove_large_angle != 0) && (local_80 == 0)) {
    diff = 0.0;
    if (fliptype == 1) {
      if (((pc != this->dummypoint) && (pe != this->dummypoint)) && (pd != this->dummypoint)) {
        tetalldihedral(this,pe,pd,pb,pc,(double *)0x0,&diff,(double *)0x0);
        local_98 = diff - fc->cosdihed_in;
        if (ABS(local_98 / fc->cosdihed_in) < this->b->epsilon) {
          local_98 = 0.0;
        }
        if (0.0 < local_98) {
          if (diff < fc->cosdihed_out) {
            fc->cosdihed_out = diff;
          }
          tetalldihedral(this,pe,pd,pc,pa,(double *)0x0,&diff,(double *)0x0);
          local_98 = diff - fc->cosdihed_in;
          if (ABS(local_98 / fc->cosdihed_in) < this->b->epsilon) {
            local_98 = 0.0;
          }
          if (0.0 < local_98) {
            if (diff < fc->cosdihed_out) {
              fc->cosdihed_out = diff;
            }
          }
          else {
            local_80 = 1;
          }
        }
        else {
          local_80 = 1;
        }
      }
    }
    else if (fliptype == 2) {
      if (level == 0) {
        if (((pa != this->dummypoint) && (pb != this->dummypoint)) && (pc != this->dummypoint)) {
          tetalldihedral(this,pa,pb,pc,pd,(double *)0x0,&diff,(double *)0x0);
          local_98 = diff - fc->cosdihed_in;
          if (ABS(local_98 / fc->cosdihed_in) < this->b->epsilon) {
            local_98 = 0.0;
          }
          if (0.0 < local_98) {
            if (diff < fc->cosdihed_out) {
              fc->cosdihed_out = diff;
            }
            tetalldihedral(this,pb,pa,pc,pe,(double *)0x0,&diff,(double *)0x0);
            local_98 = diff - fc->cosdihed_in;
            if (ABS(local_98 / fc->cosdihed_in) < this->b->epsilon) {
              local_98 = 0.0;
            }
            if (0.0 < local_98) {
              if (diff < fc->cosdihed_out) {
                fc->cosdihed_out = diff;
              }
            }
            else {
              local_80 = 1;
            }
          }
          else {
            local_80 = 1;
          }
        }
      }
      else if (edgepivot == 1) {
        if (((pa != this->dummypoint) && (pb != this->dummypoint)) && (pc != this->dummypoint)) {
          tetalldihedral(this,pb,pa,pc,pe,(double *)0x0,&diff,(double *)0x0);
          local_98 = diff - fc->cosdihed_in;
          if (ABS(local_98 / fc->cosdihed_in) < this->b->epsilon) {
            local_98 = 0.0;
          }
          if (0.0 < local_98) {
            if (diff < fc->cosdihed_out) {
              fc->cosdihed_out = diff;
            }
          }
          else {
            local_80 = 1;
          }
        }
      }
      else if (((pa != this->dummypoint) && (pb != this->dummypoint)) && (pc != this->dummypoint)) {
        tetalldihedral(this,pa,pb,pc,pd,(double *)0x0,&diff,(double *)0x0);
        local_98 = diff - fc->cosdihed_in;
        if (ABS(local_98 / fc->cosdihed_in) < this->b->epsilon) {
          local_98 = 0.0;
        }
        if (0.0 < local_98) {
          if (diff < fc->cosdihed_out) {
            fc->cosdihed_out = diff;
          }
        }
        else {
          local_80 = 1;
        }
      }
    }
  }
  return local_80;
}

Assistant:

int tetgenmesh::checkflipeligibility(int fliptype, point pa, point pb, 
                                     point pc, point pd, point pe,
                                     int level, int edgepivot,
                                     flipconstraints* fc)
{
  point tmppts[3];
  enum interresult dir;
  int types[2], poss[4];
  int intflag;
  int rejflag = 0;
  int i;

  if (fc->seg[0] != NULL) {
    // A constraining edge is given (e.g., for edge recovery).
    if (fliptype == 1) {
      // A 2-to-3 flip: [a,b,c] => [e,d,a], [e,d,b], [e,d,c].
      tmppts[0] = pa;
      tmppts[1] = pb;
      tmppts[2] = pc;
      for (i = 0; i < 3 && !rejflag; i++) {
        if (tmppts[i] != dummypoint) {
          // Test if the face [e,d,#] intersects the edge.
          intflag = tri_edge_test(pe, pd, tmppts[i], fc->seg[0], fc->seg[1], 
                                  NULL, 1, types, poss);
          if (intflag == 2) {
            // They intersect at a single point.
            dir = (enum interresult) types[0];
            if (dir == ACROSSFACE) {
              // The interior of [e,d,#] intersect the segment.
              rejflag = 1;
            } else if (dir == ACROSSEDGE) {
              if (poss[0] == 0) {
                // The interior of [e,d] intersect the segment.
                // Since [e,d] is the newly created edge. Reject this flip.
                rejflag = 1; 
              }
            }
          } else if (intflag == 4) {
            // They may intersect at either a point or a line segment.
            dir = (enum interresult) types[0];
            if (dir == ACROSSEDGE) {
              if (poss[0] == 0) {
                // The interior of [e,d] intersect the segment.
                // Since [e,d] is the newly created edge. Reject this flip.
                rejflag = 1;
              }
            }
          }
        } // if (tmppts[0] != dummypoint)
      } // i
    } else if (fliptype == 2) {
      // A 3-to-2 flip: [e,d,a], [e,d,b], [e,d,c] => [a,b,c]
      if (pc != dummypoint) {
        // Check if the new face [a,b,c] intersect the edge in its interior.
        intflag = tri_edge_test(pa, pb, pc, fc->seg[0], fc->seg[1], NULL, 
                                1, types, poss);
        if (intflag == 2) {
          // They intersect at a single point.
          dir = (enum interresult) types[0];
          if (dir == ACROSSFACE) {
            // The interior of [a,b,c] intersect the segment.
            rejflag = 1; // Do not flip.
          }
        } else if (intflag == 4) {
          // [a,b,c] is coplanar with the edge. 
          dir = (enum interresult) types[0];
          if (dir == ACROSSEDGE) {
            // The boundary of [a,b,c] intersect the segment.            
            rejflag = 1; // Do not flip.
          }
        }
      } // if (pc != dummypoint)
    }
  } // if (fc->seg[0] != NULL)

  if ((fc->fac[0] != NULL) && !rejflag) {
    // A constraining face is given (e.g., for face recovery).
    if (fliptype == 1) {
      // A 2-to-3 flip.
      // Test if the new edge [e,d] intersects the face.
      intflag = tri_edge_test(fc->fac[0], fc->fac[1], fc->fac[2], pe, pd, 
                              NULL, 1, types, poss);
      if (intflag == 2) {
        // They intersect at a single point.
        dir = (enum interresult) types[0];
        if (dir == ACROSSFACE) {
          rejflag = 1;
        } else if (dir == ACROSSEDGE) {
          rejflag = 1;
        } 
      } else if (intflag == 4) {
        // The edge [e,d] is coplanar with the face.
        // There may be two intersections.
        for (i = 0; i < 2 && !rejflag; i++) {
          dir = (enum interresult) types[i];
          if (dir == ACROSSFACE) {
            rejflag = 1;
          } else if (dir == ACROSSEDGE) {
            rejflag = 1;
          }
        }
      }
    } // if (fliptype == 1)
  } // if (fc->fac[0] != NULL)

  if ((fc->remvert != NULL) && !rejflag) {
    // The vertex is going to be removed. Do not create a new edge which
    //   contains this vertex.
    if (fliptype == 1) {
      // A 2-to-3 flip.
      if ((pd == fc->remvert) || (pe == fc->remvert)) {
        rejflag = 1;
      }
    }
  }

  if (fc->remove_large_angle && !rejflag) {
    // Remove a large dihedral angle. Do not create a new small angle.
    REAL cosmaxd = 0, diff;
    if (fliptype == 1) {
      // We assume that neither 'a' nor 'b' is dummypoint.
      // A 2-to-3 flip: [a,b,c] => [e,d,a], [e,d,b], [e,d,c].
      // The new tet [e,d,a,b] will be flipped later. Only two new tets:
      //   [e,d,b,c] and [e,d,c,a] need to be checked.
      if ((pc != dummypoint) && (pe != dummypoint) && (pd != dummypoint)) {
        // Get the largest dihedral angle of [e,d,b,c].
        tetalldihedral(pe, pd, pb, pc, NULL, &cosmaxd, NULL);
        diff = cosmaxd - fc->cosdihed_in;
        if (fabs(diff/fc->cosdihed_in) < b->epsilon) diff = 0.0; // Rounding.
        if (diff <= 0) { //if (cosmaxd <= fc->cosdihed_in) {
          rejflag = 1;
        } else {
          // Record the largest new angle.
          if (cosmaxd < fc->cosdihed_out) {
            fc->cosdihed_out = cosmaxd; 
          }
          // Get the largest dihedral angle of [e,d,c,a].
          tetalldihedral(pe, pd, pc, pa, NULL, &cosmaxd, NULL);
          diff = cosmaxd - fc->cosdihed_in;
          if (fabs(diff/fc->cosdihed_in) < b->epsilon) diff = 0.0; // Rounding.
          if (diff <= 0) { //if (cosmaxd <= fc->cosdihed_in) {
            rejflag = 1;
          } else {
            // Record the largest new angle.
            if (cosmaxd < fc->cosdihed_out) {
              fc->cosdihed_out = cosmaxd; 
            }
          }
        }
      } // if (pc != dummypoint && ...)
    } else if (fliptype == 2) {
      // A 3-to-2 flip: [e,d,a], [e,d,b], [e,d,c] => [a,b,c]
      // We assume that neither 'e' nor 'd' is dummypoint.
      if (level == 0) {
        // Both new tets [a,b,c,d] and [b,a,c,e] are new tets.
        if ((pa != dummypoint) && (pb != dummypoint) && (pc != dummypoint)) {
          // Get the largest dihedral angle of [a,b,c,d].
          tetalldihedral(pa, pb, pc, pd, NULL, &cosmaxd, NULL);
          diff = cosmaxd - fc->cosdihed_in;
          if (fabs(diff/fc->cosdihed_in) < b->epsilon) diff = 0.0; // Rounding
          if (diff <= 0) { //if (cosmaxd <= fc->cosdihed_in) {
            rejflag = 1;
          } else {
            // Record the largest new angle.
            if (cosmaxd < fc->cosdihed_out) {
              fc->cosdihed_out = cosmaxd; 
            }
            // Get the largest dihedral angle of [b,a,c,e].
            tetalldihedral(pb, pa, pc, pe, NULL, &cosmaxd, NULL);
            diff = cosmaxd - fc->cosdihed_in;
            if (fabs(diff/fc->cosdihed_in) < b->epsilon) diff = 0.0;// Rounding
            if (diff <= 0) { //if (cosmaxd <= fc->cosdihed_in) {
              rejflag = 1;
            } else {
              // Record the largest new angle.
              if (cosmaxd < fc->cosdihed_out) {
                fc->cosdihed_out = cosmaxd; 
              }
            }
          }
        }
      } else { // level > 0
        if (edgepivot == 1) {
          // The new tet [a,b,c,d] will be flipped. Only check [b,a,c,e].
          if ((pa != dummypoint) && (pb != dummypoint) && (pc != dummypoint)) {
            // Get the largest dihedral angle of [b,a,c,e].
            tetalldihedral(pb, pa, pc, pe, NULL, &cosmaxd, NULL);
            diff = cosmaxd - fc->cosdihed_in;
            if (fabs(diff/fc->cosdihed_in) < b->epsilon) diff = 0.0;// Rounding
            if (diff <= 0) { //if (cosmaxd <= fc->cosdihed_in) {
              rejflag = 1;
            } else {
              // Record the largest new angle.
              if (cosmaxd < fc->cosdihed_out) {
                fc->cosdihed_out = cosmaxd; 
              }
            }
          }
        } else {
          // The new tet [b,a,c,e] will be flipped. Only check [a,b,c,d].
          if ((pa != dummypoint) && (pb != dummypoint) && (pc != dummypoint)) {
            // Get the largest dihedral angle of [b,a,c,e].
            tetalldihedral(pa, pb, pc, pd, NULL, &cosmaxd, NULL);
            diff = cosmaxd - fc->cosdihed_in;
            if (fabs(diff/fc->cosdihed_in) < b->epsilon) diff = 0.0;// Rounding
            if (diff <= 0) { //if (cosmaxd <= fc->cosdihed_in) {
              rejflag = 1;
            } else {
              // Record the largest new angle.
              if (cosmaxd < fc->cosdihed_out) {
                fc->cosdihed_out = cosmaxd; 
              }
            }
          }
        } // edgepivot
      } // level
    }
  }

  return rejflag;
}